

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct::load_model(InnerProduct *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  long in_RDI;
  Mat *in_stack_fffffffffffffe90;
  Mat *m;
  Mat *in_stack_fffffffffffffe98;
  Mat *this_00;
  Mat local_148;
  Mat local_100;
  undefined1 local_b8 [88];
  undefined1 local_60 [72];
  long *local_18;
  int local_4;
  
  local_18 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(local_60,in_RSI,*(undefined4 *)(in_RDI + 0xd8),0);
  Mat::operator=(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  Mat::~Mat((Mat *)0x387e0f);
  bVar1 = Mat::empty(in_stack_fffffffffffffe90);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0xd4) != 0) {
      (**(code **)(*local_18 + 0x10))(local_b8,local_18,*(undefined4 *)(in_RDI + 0xd0),1);
      Mat::operator=(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      Mat::~Mat((Mat *)0x387ec1);
      bVar1 = Mat::empty(in_stack_fffffffffffffe90);
      if (bVar1) {
        return -100;
      }
    }
    if (*(int *)(in_RDI + 0xdc) != 0) {
      this_00 = &local_100;
      (**(code **)(*local_18 + 0x10))(this_00,local_18,*(undefined4 *)(in_RDI + 0xd0),1);
      Mat::operator=(this_00,in_stack_fffffffffffffe90);
      Mat::~Mat((Mat *)0x387f6f);
      m = &local_148;
      (**(code **)(*local_18 + 0x10))(m,local_18,1);
      Mat::operator=(this_00,m);
      Mat::~Mat((Mat *)0x387fb3);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int InnerProduct::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term)
    {
        weight_data_int8_scales = mb.load(num_output, 1);
        bottom_blob_int8_scales = mb.load(1, 1);
    }
#endif // NCNN_INT8

    return 0;
}